

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapePrism>::FillOrderScalarShapeFunctions
               (TPZVec<int> *connectorders,TPZVec<int> *scalarorder)

{
  int local_14;
  
  (*scalarorder->_vptr_TPZVec[4])(scalarorder,0xf);
  TPZVec<int>::Fill(scalarorder,&local_14,0,-1);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::FillOrderScalarShapeFunctions(const TPZVec<int> &connectorders, TPZVec<int> &scalarorder)
{
    scalarorder.resize(TSHAPE::NSides-TSHAPE::NCornerNodes);
    const int ncon = TSHAPE::NFacets;
    int internalorder = connectorders[ncon];
    scalarorder.Fill(internalorder+1);
#ifdef PZDEBUG
    for(int ic=0; ic<ncon-1; ic++)
    {
        if(connectorders[ic] > internalorder) DebugStop();
    }
#endif
    return;
}